

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPValueIteration.cpp
# Opt level: O1

void __thiscall
MDPValueIteration::
Plan<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
          (MDPValueIteration *this,
          vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
          *T)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  PlanningUnitDecPOMDPDiscrete *this_00;
  size_t sVar6;
  DecPOMDPDiscreteInterface *pDVar7;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar8;
  pointer pdVar9;
  size_type sVar10;
  pointer pdVar11;
  pointer pQVar12;
  size_type __n;
  size_type sVar13;
  TimedAlgorithm *pTVar14;
  size_t S;
  size_t A;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  char *__end;
  pointer pdVar19;
  pointer pdVar20;
  TimedAlgorithm *pTVar21;
  ulong uVar22;
  uint uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  QTable immReward;
  ulong local_118;
  undefined1 local_110 [24];
  new_allocator<double> local_f8 [8];
  size_type local_f0;
  TimedAlgorithm *pTStack_e8;
  ulong local_e0;
  MDPValueIteration *local_d8;
  TimedAlgorithm *local_d0;
  pointer local_c8;
  pointer local_c0;
  pointer local_b8;
  size_type local_b0;
  size_type local_a8;
  pointer local_a0;
  string local_98;
  TimedAlgorithm *local_78;
  vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *local_70;
  ulong local_68;
  QTable local_60;
  
  this_00 = (this->super_MDPSolver)._m_pu;
  sVar6 = (this_00->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  local_70 = T;
  S = PlanningUnitMADPDiscrete::GetNrStates(&this_00->super_PlanningUnitMADPDiscrete);
  A = (**(code **)((long)*(((this->super_MDPSolver)._m_pu)->super_PlanningUnitMADPDiscrete)._m_madp
                  + 0x68))();
  pDVar7 = ((this->super_MDPSolver)._m_pu)->_m_DecPOMDP;
  local_68 = (**(code **)(*(long *)((long)&pDVar7->field_0x0 + *(long *)(*(long *)pDVar7 + -0xb0)) +
                         0x70))((long)&pDVar7->field_0x0 + *(long *)(*(long *)pDVar7 + -0xb0));
  QTable::QTable(&local_60,S,A);
  if (S != 0) {
    uVar22 = 0;
    do {
      if (A != 0) {
        uVar23 = 1;
        uVar17 = 0;
        do {
          pDVar7 = ((this->super_MDPSolver)._m_pu)->_m_DecPOMDP;
          dVar26 = (double)(**(code **)(*(long *)pDVar7 + 0xc0))(pDVar7,uVar22,uVar23 - 1);
          local_60.super_matrix_t.data_.data_[local_60.super_matrix_t.size2_ * uVar22 + uVar17] =
               dVar26;
          uVar17 = (ulong)uVar23;
          uVar23 = uVar23 + 1;
        } while (uVar17 < A);
      }
      uVar22 = (ulong)((int)uVar22 + 1);
    } while (uVar22 < S);
  }
  local_d8 = this;
  if (this->_m_finiteHorizon == false) {
    local_f0 = 0;
    pTStack_e8 = (TimedAlgorithm *)0x0;
    local_110._8_8_ = 0;
    local_110._16_8_ = 0;
    local_110._0_8_ = &PTR_Get_005cdfc0;
    pTVar21 = &this->super_TimedAlgorithm;
    local_78 = pTVar21;
    do {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Iteration","");
      TimedAlgorithm::StartTimer(pTVar21,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pTVar14 = pTStack_e8;
      pQVar12 = (this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_110._8_8_ = (pQVar12->super_matrix_t).size1_;
      local_110._16_8_ = (pQVar12->super_matrix_t).size2_;
      if ((pointer)local_110 != pQVar12) {
        __n = (pQVar12->super_matrix_t).data_.size_;
        if (local_f0 != __n) {
          if (__n != 0) {
            pTStack_e8 = (TimedAlgorithm *)
                         __gnu_cxx::new_allocator<double>::allocate
                                   ((new_allocator<double> *)(local_110 + 0x18),__n,(void *)0x0);
          }
          if (local_f0 != 0) {
            operator_delete(pTVar14,local_f0 << 3);
          }
          pTVar21 = local_78;
          local_f0 = __n;
          if (__n == 0) {
            pTStack_e8 = (TimedAlgorithm *)0x0;
          }
        }
        this = local_d8;
        sVar13 = (pQVar12->super_matrix_t).data_.size_;
        if (sVar13 != 0) {
          memmove(pTStack_e8,(pQVar12->super_matrix_t).data_.data_,sVar13 << 3);
        }
      }
      if (A == 0) {
        bVar24 = false;
      }
      else {
        local_b8 = (local_70->
                   super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        local_b0 = local_60.super_matrix_t.size2_;
        local_c0 = local_60.super_matrix_t.data_.data_;
        local_c8 = (this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_d0 = pTStack_e8;
        auVar29 = ZEXT864(0) << 0x40;
        uVar22 = 0;
        do {
          local_e0 = uVar22;
          pmVar8 = local_b8[local_e0];
          uVar22 = pmVar8->size2_;
          uVar17 = pmVar8->size1_ * uVar22;
          if ((uVar17 & 0x1fffffffffffffff) != 0) {
            pdVar9 = (pmVar8->data_).data_;
            local_a0 = pdVar9 + uVar17;
            local_a8 = *(size_type *)&(local_c8->super_matrix_t).size2_;
            pdVar11 = (local_c8->super_matrix_t).data_.data_;
            pdVar19 = pdVar9;
            do {
              if (uVar22 == 0) {
                uVar17 = 0;
              }
              else {
                uVar17 = (ulong)((long)pdVar19 - (long)pdVar9 >> 3) / uVar22 & 0xffffffff;
              }
              auVar25._8_8_ = 0;
              auVar25._0_8_ =
                   local_60.super_matrix_t.data_.data_
                   [local_e0 + local_60.super_matrix_t.size2_ * uVar17];
              if (uVar22 == 0) {
                uVar16 = 0;
              }
              else {
                uVar16 = (ulong)((long)pdVar19 - (long)pdVar9 >> 3) / uVar22;
              }
              pdVar20 = pdVar9 + uVar16 * uVar22;
              auVar30 = ZEXT816(0) << 0x40;
              while( true ) {
                if (uVar22 == 0) {
                  uVar16 = 0;
                }
                else {
                  uVar16 = (ulong)((long)pdVar19 - (long)pdVar9 >> 3) / uVar22;
                }
                if (pdVar20 == pdVar9 + uVar22 + uVar16 * uVar22) break;
                if (uVar22 == 0) {
                  uVar16 = 0;
                }
                else {
                  uVar16 = (ulong)((long)pdVar20 - (long)pdVar9 >> 3) % uVar22 & 0xffffffff;
                }
                uVar15 = 0;
                auVar31 = ZEXT816(0xffefffffffffffff);
                do {
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = (&pTStack_e8->_vptr_TimedAlgorithm)
                                 [uVar16 * local_110._16_8_ + uVar15];
                  auVar31 = vmaxsd_avx(auVar31,auVar4);
                  uVar15 = uVar15 + 1;
                } while ((uVar15 & 0xffffffff) < A);
                auVar5._8_8_ = 0;
                auVar5._0_8_ = *pdVar20;
                auVar30 = vfmadd231sd_fma(auVar30,auVar31,auVar5);
                pdVar20 = pdVar20 + 1;
              }
              auVar31._8_8_ = 0;
              auVar31._0_8_ = local_68;
              auVar25 = vfmadd132sd_fma(auVar30,auVar25,auVar31);
              pdVar11[local_e0 + local_a8 * uVar17] = auVar25._0_8_;
              auVar30._8_8_ = 0x7fffffffffffffff;
              auVar30._0_8_ = 0x7fffffffffffffff;
              auVar28._8_8_ = 0;
              auVar28._0_8_ =
                   (double)(&pTStack_e8->_vptr_TimedAlgorithm)[local_e0 + uVar17 * local_110._16_8_]
                   - auVar25._0_8_;
              auVar25 = vandpd_avx512vl(auVar28,auVar30);
              auVar25 = vmaxsd_avx(auVar25,auVar29._0_16_);
              auVar29 = ZEXT1664(auVar25);
              pdVar19 = pdVar19 + uVar22;
            } while (pdVar19 != local_a0);
          }
          uVar22 = local_e0 + 1;
        } while ((local_e0 + 1 & 0xffffffff) < A);
        bVar24 = 0.0001 < auVar29._0_8_;
        this = local_d8;
        pTVar21 = local_78;
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Iteration","");
      TimedAlgorithm::StopTimer(pTVar21,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    } while (bVar24);
    if (local_f0 != 0) {
      operator_delete(pTStack_e8,local_f0 << 3);
    }
  }
  else {
    uVar22 = sVar6 - 1;
    pTVar21 = &this->super_TimedAlgorithm;
    local_118 = uVar22;
    local_d0 = pTVar21;
    do {
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"Iteration","");
      TimedAlgorithm::StartTimer(pTVar21,(string *)local_110);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if (A != 0) {
        local_b8 = (local_70->
                   super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        local_c0 = local_60.super_matrix_t.data_.data_;
        local_b0 = local_118 * 0x30;
        local_c8 = (pointer)&(local_d8->_m_QValues).
                             super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
                             super__Vector_impl_data._M_start[local_118].super_matrix_t;
        local_a8 = local_60.super_matrix_t.size2_;
        uVar17 = 0;
        do {
          local_e0 = uVar17;
          pmVar8 = local_b8[local_e0];
          uVar17 = pmVar8->size2_;
          uVar16 = pmVar8->size1_ * uVar17;
          if ((uVar16 & 0x1fffffffffffffff) != 0) {
            pdVar9 = (pmVar8->data_).data_;
            local_a0 = pdVar9 + uVar16;
            sVar10 = ((matrix_t *)local_c8)->size2_;
            pdVar11 = (((matrix_t *)local_c8)->data_).data_;
            pdVar19 = pdVar9;
            do {
              if (uVar17 == 0) {
                uVar16 = 0;
              }
              else {
                uVar16 = (ulong)((long)pdVar19 - (long)pdVar9 >> 3) / uVar17 & 0xffffffff;
              }
              auVar27._8_8_ = 0;
              auVar27._0_8_ =
                   local_60.super_matrix_t.data_.data_
                   [local_e0 + local_60.super_matrix_t.size2_ * uVar16];
              auVar25 = ZEXT816(0) << 0x40;
              auVar29 = ZEXT864(0) << 0x40;
              if (local_118 < uVar22) {
                if (uVar17 == 0) {
                  uVar15 = 0;
                }
                else {
                  uVar15 = (ulong)((long)pdVar19 - (long)pdVar9 >> 3) / uVar17;
                }
                pdVar20 = pdVar9 + uVar15 * uVar17;
                pQVar12 = (local_d8->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                while( true ) {
                  auVar25 = auVar29._0_16_;
                  if (uVar17 == 0) {
                    uVar15 = 0;
                  }
                  else {
                    uVar15 = (ulong)((long)pdVar19 - (long)pdVar9 >> 3) / uVar17;
                  }
                  if (pdVar20 == pdVar9 + uVar17 + uVar15 * uVar17) break;
                  if (uVar17 == 0) {
                    uVar15 = 0;
                  }
                  else {
                    uVar15 = (ulong)((long)pdVar20 - (long)pdVar9 >> 3) % uVar17 & 0xffffffff;
                  }
                  uVar18 = 0;
                  auVar30 = ZEXT816(0xffefffffffffffff);
                  do {
                    auVar1._8_8_ = 0;
                    auVar1._0_8_ = pQVar12[local_118 + 1].super_matrix_t.data_.data_
                                   [uVar15 * pQVar12[local_118 + 1].super_matrix_t.size2_ + uVar18];
                    auVar30 = vmaxsd_avx(auVar30,auVar1);
                    uVar18 = uVar18 + 1;
                  } while ((uVar18 & 0xffffffff) < A);
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = *pdVar20;
                  auVar25 = vfmadd231sd_fma(auVar25,auVar30,auVar2);
                  auVar29 = ZEXT1664(auVar25);
                  pdVar20 = pdVar20 + 1;
                }
              }
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_68;
              auVar25 = vfmadd132sd_fma(auVar25,auVar27,auVar3);
              pdVar11[local_e0 + uVar16 * sVar10] = auVar25._0_8_;
              pdVar19 = pdVar19 + uVar17;
            } while (pdVar19 != local_a0);
          }
          uVar17 = local_e0 + 1;
        } while ((local_e0 + 1 & 0xffffffff) < A);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"Iteration","");
      pTVar21 = local_d0;
      TimedAlgorithm::StopTimer(local_d0,(string *)local_110);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      bVar24 = local_118 != 0;
      local_118 = local_118 - 1;
    } while (bVar24);
  }
  if (local_60.super_matrix_t.data_.size_ != 0) {
    operator_delete(local_60.super_matrix_t.data_.data_,local_60.super_matrix_t.data_.size_ << 3);
  }
  return;
}

Assistant:

void MDPValueIteration::Plan(std::vector<const M*> T)
{
    size_t horizon = GetPU()->GetHorizon();
    size_t nrS = GetPU()->GetNrStates();
    size_t nrJA =  GetPU()->GetNrJointActions();
    
    Index sI,ssucI;
    double gamma=GetPU()->GetDiscount();
    double R_i,R_f,maxQsuc;
    
    // cache immediate reward for speed
    QTable immReward(nrS,nrJA);
    for(Index sI = 0; sI < nrS; sI++)
        for(Index jaI = 0; jaI < nrJA; jaI++)
            immReward(sI,jaI)=GetPU()->GetReward(sI, jaI);
    
    if(_m_finiteHorizon)
    {
        for(size_t t = horizon - 1; true; t--)
        {
            StartTimer("Iteration");
            for(Index jaI = 0; jaI < nrJA; jaI++)
            {
                for(typename M::const_iterator1 ri=T[jaI]->begin1();
                    ri!=T[jaI]->end1(); ++ri)
                {
                    sI=ri.index1();
                    
                    //calc. expected immediate reward
                    R_i = immReward(sI,jaI);
                    R_f = 0.0;
                    if(t < horizon - 1)
                    {
                        //calc. expected future reward
                        for (typename M::const_iterator2 ci = ri.begin();
                             ci != ri.end(); ++ci)
                        {
                            ssucI=ci.index2();
                            //find the best action at ssucI
                            maxQsuc = -DBL_MAX;
                            for(Index jasucI = 0; jasucI < nrJA; jasucI++)
                                maxQsuc = std::max( _m_QValues[t+1](ssucI,jasucI),
                                                    maxQsuc);
                            
                            R_f += *ci * maxQsuc;
                        }//done calc. expected future reward
                    }
                    _m_QValues[t](sI,jaI) = R_i + gamma*R_f;
                }//end for jaI
            }//end for sI
            StopTimer("Iteration");
            if(t == 0) //escape from (loop t is unsigned!)
                break;
        }
    }
    else // infinite horizon problem
    {
        double maxDelta=DBL_MAX;
        QTable oldQtable;
        
        while(maxDelta>1e-4)
        {
            StartTimer("Iteration");
            maxDelta=0;
            oldQtable=_m_QValues[0];
            for(Index jaI = 0; jaI < nrJA; jaI++)
            {
                for(typename M::const_iterator1 ri=T[jaI]->begin1();
                    ri!=T[jaI]->end1(); ++ri)
                {
                    sI=ri.index1();
                    
                    //calc. expected immediate reward
                    R_i = immReward(sI,jaI);
                    R_f = 0.0;
                    //calc. expected future reward
                    
                    for (typename M::const_iterator2 ci = ri.begin();
                         ci != ri.end(); ++ci)
                    {
                        ssucI=ci.index2();
                        
                        //find the best action at ssucI
                        maxQsuc = -DBL_MAX;
                        for(Index jasucI = 0; jasucI < nrJA; jasucI++)
                            maxQsuc = std::max( oldQtable(ssucI,jasucI),
                                                maxQsuc);
                            
                        R_f += *ci * maxQsuc;
                    }//done calc. expected future reward
                    
                    _m_QValues[0](sI,jaI) = R_i + gamma*R_f;
                    maxDelta=std::max(maxDelta,
                                      std::abs(oldQtable(sI,jaI)-
                                               _m_QValues[0](sI,jaI)));
                }//end for jaI
            }//end for sI
            
            StopTimer("Iteration");

#if DEBUG_MDPValueIteration
            std::cout << "delta " << maxDelta << std::endl;
            PrintTimersSummary();
#endif
        }
    }
}